

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O3

void lvlfill_solid(level *lev,schar filling,schar lit)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  uint *puVar6;
  uint *puVar7;
  long lVar8;
  
  if (1 < x_maze_max) {
    uVar4 = (ulong)(uint)y_maze_max;
    puVar6 = (uint *)&lev->locations[2][0].field_0x6;
    lVar5 = 2;
    iVar2 = x_maze_max;
    do {
      if (-1 < (int)uVar4) {
        lVar8 = -1;
        puVar7 = puVar6;
        do {
          if ((filling < '\'') && (*(schar *)((long)puVar7 + -2) = filling, filling == '\x15')) {
            *(byte *)((long)puVar7 + 1) = *(byte *)((long)puVar7 + 1) | 4;
          }
          else if (lit != -2) {
            if (lit == -1) {
              uVar3 = mt_random();
              *puVar7 = *puVar7 & 0xfffffbff | (uVar3 & 1) << 10;
            }
            else {
              *puVar7 = *puVar7 & 0xfffffbff | (uint)(lit & 1) << 10;
            }
          }
          uVar4 = (ulong)y_maze_max;
          lVar8 = lVar8 + 1;
          puVar7 = puVar7 + 3;
          iVar2 = x_maze_max;
        } while (lVar8 < (long)uVar4);
      }
      puVar6 = puVar6 + 0x3f;
      bVar1 = lVar5 < iVar2;
      lVar5 = lVar5 + 1;
    } while (bVar1);
  }
  return;
}

Assistant:

static void lvlfill_solid(struct level *lev, schar filling, schar lit)
{
	int x, y;

	for (x = 2; x <= x_maze_max; x++) {
	    for (y = 0; y <= y_maze_max; y++) {
		SET_TYPLIT(lev, x, y, filling, lit);
	    }
	}
}